

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::Clara::Detail::convertInto(string *_source,bool *_dest)

{
  bool bVar1;
  int iVar2;
  runtime_error *this;
  bool bVar3;
  size_type sVar4;
  string sourceLC;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&sourceLC,(string *)_source);
  for (sVar4 = 0; sourceLC._M_string_length != sVar4; sVar4 = sVar4 + 1) {
    iVar2 = tolower((int)sourceLC._M_dataplus._M_p[sVar4]);
    sourceLC._M_dataplus._M_p[sVar4] = (char)iVar2;
  }
  bVar1 = std::operator==(&sourceLC,"y");
  bVar3 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&sourceLC,"1");
    if (!bVar1) {
      bVar1 = std::operator==(&sourceLC,"true");
      if (!bVar1) {
        bVar1 = std::operator==(&sourceLC,"yes");
        if (!bVar1) {
          bVar1 = std::operator==(&sourceLC,"on");
          if (!bVar1) {
            bVar1 = std::operator==(&sourceLC,"n");
            if (!bVar1) {
              bVar1 = std::operator==(&sourceLC,"0");
              if (!bVar1) {
                bVar1 = std::operator==(&sourceLC,"false");
                if (!bVar1) {
                  bVar1 = std::operator==(&sourceLC,"no");
                  if (!bVar1) {
                    bVar1 = std::operator==(&sourceLC,"off");
                    if (!bVar1) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(&local_70,
                                     "Expected a boolean value but did not recognise:\n  \'",_source
                                    );
                      std::operator+(&local_50,&local_70,"\'");
                      std::runtime_error::runtime_error(this,(string *)&local_50);
                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                  }
                }
              }
            }
            bVar3 = false;
          }
        }
      }
    }
  }
  *_dest = bVar3;
  std::__cxx11::string::~string((string *)&sourceLC);
  return;
}

Assistant:

inline void convertInto( std::string const& _source, bool& _dest ) {
            std::string sourceLC = _source;
            std::transform( sourceLC.begin(), sourceLC.end(), sourceLC.begin(), ::tolower );
            if( sourceLC == "y" || sourceLC == "1" || sourceLC == "true" || sourceLC == "yes" || sourceLC == "on" )
                _dest = true;
            else if( sourceLC == "n" || sourceLC == "0" || sourceLC == "false" || sourceLC == "no" || sourceLC == "off" )
                _dest = false;
            else
                throw std::runtime_error( "Expected a boolean value but did not recognise:\n  '" + _source + "'" );
        }